

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_partition::~xr_partition(xr_partition *this)

{
  ~xr_partition(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

xr_partition::~xr_partition() {}